

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O2

void __thiscall PSAC_Lcp1_Test::TestBody(PSAC_Lcp1_Test *this)

{
  char *in_R9;
  AssertHelper AStack_188;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  string local_178;
  AssertionResult gtest_ar_;
  comm c;
  string local_str;
  string str;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  sa;
  
  mxx::comm::comm(&c);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  if (c.m_rank == 0) {
    rand_dna_abi_cxx11_((string *)&sa,0x104cb,0x17);
    std::__cxx11::string::operator=((string *)&str,(string *)&sa);
    std::__cxx11::string::~string((string *)&sa);
  }
  mxx::impl::
  distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::stable_distribute(&local_str,&str,&c);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::suffix_array(&sa,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_str._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_str._M_dataplus._M_p + local_str._M_string_length),&c);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::construct(&sa,true,0);
  gtest_ar_.success_ =
       check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                 (&sa,&str,&c);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)&gtest_ar_,(AssertionResult *)"check_sa_dss(sa, str, c)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xee,local_178._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    std::__cxx11::string::~string((string *)&local_178);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       check_lcp_eq<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                 (&sa,&local_str,&c);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)&gtest_ar_,(AssertionResult *)"check_lcp_eq(sa, local_str, c)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xef,local_178._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    std::__cxx11::string::~string((string *)&local_178);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::construct(&sa,true,3);
  gtest_ar_.success_ =
       check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                 (&sa,&str,&c);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)&gtest_ar_,(AssertionResult *)"check_sa_dss(sa, str, c)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xf2,local_178._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    std::__cxx11::string::~string((string *)&local_178);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       check_lcp_eq<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
                 (&sa,&local_str,&c);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)&gtest_ar_,(AssertionResult *)"check_lcp_eq(sa, local_str, c)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xf3,local_178._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_188,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    std::__cxx11::string::~string((string *)&local_178);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  ::~suffix_array(&sa);
  std::__cxx11::string::~string((string *)&local_str);
  std::__cxx11::string::~string((string *)&str);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(PSAC, Lcp1) {
    mxx::comm c;

    size_t size = 66763;

    std::string str;
    if (c.rank() == 0) {
        // generate some random input string
        str = rand_dna(size, 23);
    }
    // distribute string equally
    std::string local_str = mxx::stable_distribute(str, c);

    // create suffix array w/o LCP
    suffix_array<std::string::iterator, uint64_t, true> sa(local_str.begin(), local_str.end(), c);

    // construct suffix  and LCP array
    sa.construct();
    EXPECT_TRUE(check_sa_dss(sa, str, c));
    EXPECT_TRUE(check_lcp_eq(sa, local_str, c));
    // construct suffix and LCP array using artificial small `k` to force bucket chaising
    sa.construct(true, 3);
    EXPECT_TRUE(check_sa_dss(sa, str, c));
    EXPECT_TRUE(check_lcp_eq(sa, local_str, c));
}